

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

bool IsConfSupported(KeyInfo *key,string *error)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&key->name,"conf");
  if (iVar2 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (error,0,error->_M_string_length,
               "conf cannot be set in the configuration file; use includeconf= if you want to include additional config files"
               ,0x6d);
  }
  else {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&key->name,"reindex");
    if (iVar3 == 0) {
      logging_function._M_str = "IsConfSupported";
      logging_function._M_len = 0xf;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
      ;
      source_file._M_len = 0x61;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x56,ALL,Info,(ConstevalFormatString<0U>)0x4dc198);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool IsConfSupported(KeyInfo& key, std::string& error) {
    if (key.name == "conf") {
        error = "conf cannot be set in the configuration file; use includeconf= if you want to include additional config files";
        return false;
    }
    if (key.name == "reindex") {
        // reindex can be set in a config file but it is strongly discouraged as this will cause the node to reindex on
        // every restart. Allow the config but throw a warning
        LogPrintf("Warning: reindex=1 is set in the configuration file, which will significantly slow down startup. Consider removing or commenting out this option for better performance, unless there is currently a condition which makes rebuilding the indexes necessary\n");
        return true;
    }
    return true;
}